

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.h
# Opt level: O1

void __thiscall basist::ktx2_transcoder_state::clear(ktx2_transcoder_state *this)

{
  uchar *__ptr;
  
  basisu_transcoder_state::clear(&this->m_transcoder_state);
  __ptr = (this->m_level_uncomp_data).m_p;
  if (__ptr != (uchar *)0x0) {
    free(__ptr);
    (this->m_level_uncomp_data).m_p = (uchar *)0x0;
    (this->m_level_uncomp_data).m_size = 0;
    (this->m_level_uncomp_data).m_capacity = 0;
  }
  this->m_uncomp_data_level_index = -1;
  return;
}

Assistant:

void clear()
		{
			m_transcoder_state.clear();
			m_level_uncomp_data.clear();
			m_uncomp_data_level_index = -1;
		}